

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O3

void __thiscall amrex::ParmParse::add(ParmParse *this,char *name,IntVect *val)

{
  _Node *p_Var1;
  PP_entry entry;
  stringstream val_1;
  allocator local_249;
  string local_248;
  string local_228;
  string local_208;
  PP_entry local_1e8;
  stringstream local_1a0 [16];
  long local_190;
  undefined8 local_188 [13];
  ios_base local_120 [264];
  
  std::__cxx11::string::string((string *)&local_208,name,&local_249);
  prefixedName(&local_248,this,&local_208);
  std::__cxx11::stringstream::stringstream(local_1a0);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0x11;
  amrex::operator<<((ostream *)&local_190,val);
  std::__cxx11::stringbuf::str();
  PP_entry::PP_entry(&local_1e8,&local_248,&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  local_1e8.m_queried = true;
  p_Var1 = std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>
           ::_M_create_node<amrex::ParmParse::PP_entry_const&>
                     ((list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>> *
                      )&(anonymous_namespace)::g_table_abi_cxx11_,&local_1e8);
  std::__detail::_List_node_base::_M_hook(&p_Var1->super__List_node_base);
  _DAT_0071a3d0 = _DAT_0071a3d0 + 1;
  PP_entry::~PP_entry(&local_1e8);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
ParmParse::add (const char* name,
                const IntVect&  val)
{
    saddval(prefixedName(name),val);
}